

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

long xmlTextReaderByteConsumed(xmlTextReaderPtr reader)

{
  xmlParserInputPtr pxVar1;
  xmlChar *pxVar2;
  
  pxVar2 = (xmlChar *)0xffffffffffffffff;
  if (((reader != (xmlTextReaderPtr)0x0) && (reader->ctxt != (xmlParserCtxtPtr)0x0)) &&
     (pxVar1 = reader->ctxt->input, pxVar1 != (xmlParserInputPtr)0x0)) {
    pxVar2 = pxVar1->cur + (pxVar1->consumed - (long)pxVar1->base);
  }
  return (long)pxVar2;
}

Assistant:

long
xmlTextReaderByteConsumed(xmlTextReaderPtr reader) {
    xmlParserInputPtr in;

    if ((reader == NULL) || (reader->ctxt == NULL))
        return(-1);
    in = reader->ctxt->input;
    if (in == NULL)
        return(-1);
    return(in->consumed + (in->cur - in->base));
}